

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicLattice.cpp
# Opt level: O3

int __thiscall
RhombicLattice::neighbour(RhombicLattice *this,int vertexIndex,string *direction,int sign)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  cartesian4 cVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ostream *poVar10;
  invalid_argument *piVar11;
  uint uVar12;
  uint uVar13;
  cartesian4 cVar14;
  string errorMessage;
  string errorDir;
  cartesian4 errorCoord;
  ostringstream stream;
  cartesian4 local_210;
  int local_1fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  char *local_1d8;
  long local_1d0;
  char local_1c8 [16];
  cartesian4 local_1b8;
  ostringstream local_1a8 [376];
  
  if ((sign != -1) && (sign != 1)) {
    piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar11,"Sign must be either 1 or -1.");
LAB_0012538c:
    __cxa_throw(piVar11,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  iVar7 = std::__cxx11::string::compare((char *)direction);
  if ((((iVar7 != 0) && (iVar7 = std::__cxx11::string::compare((char *)direction), iVar7 != 0)) &&
      (iVar7 = std::__cxx11::string::compare((char *)direction), iVar7 != 0)) &&
     (iVar7 = std::__cxx11::string::compare((char *)direction), iVar7 != 0)) {
    piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar11,"Direction must be one of \'xy\', \'xz\', \'yz\' or \'xyz\'.");
    goto LAB_0012538c;
  }
  local_1fc = vertexIndex;
  cVar14 = Lattice::indexToCoordinate(&this->super_Lattice,vertexIndex);
  auVar1 = cVar14._0_12_;
  uVar13 = cVar14.y;
  local_210 = cVar14;
  iVar8 = std::__cxx11::string::compare((char *)direction);
  iVar7 = sign >> 0x1f;
  if (cVar14.w == 1) {
    if (iVar8 == 0) {
      local_210.x = cVar14.x + (uint)(0 < sign);
      auVar1._4_4_ = 0;
      auVar1._0_4_ = local_210.x;
      uVar13 = uVar13 + (0 < sign);
      local_210.y = uVar13;
      local_210.z = cVar14.z - iVar7;
      local_210.w = 0;
      auVar1._8_4_ = local_210.z;
    }
    iVar8 = std::__cxx11::string::compare((char *)direction);
    cVar14 = local_210;
    if (iVar8 == 0) {
      uVar12 = auVar1._0_4_ + (uint)(0 < sign);
      auVar3._4_4_ = 0;
      auVar3._0_4_ = uVar12;
      local_210.x = uVar12;
      cVar6 = local_210;
      local_210.z = auVar1._8_4_ + (uint)(0 < sign);
      auVar3._8_4_ = local_210.z;
      local_210.w = cVar14.w;
      local_210._0_8_ = cVar6._0_8_;
      uVar13 = uVar13 - iVar7;
      local_210.y = uVar13;
      local_210.w = 0;
      auVar1 = auVar3;
    }
    iVar8 = std::__cxx11::string::compare((char *)direction);
    cVar14 = local_210;
    if (iVar8 == 0) {
      uVar13 = uVar13 + (0 < sign);
      auVar4._4_4_ = local_210.z;
      auVar4._8_4_ = local_210.w;
      auVar4._0_4_ = uVar13;
      local_210._0_8_ = auVar4._0_8_ << 0x20;
      local_210.z = auVar1._8_4_ + (uint)(0 < sign);
      local_210.w = cVar14.w;
      uVar12 = auVar1._0_4_ - iVar7;
      auVar1._4_4_ = 0;
      auVar1._0_4_ = uVar12;
      auVar1._8_4_ = local_210.z;
      local_210.x = uVar12;
      local_210.w = 0;
    }
    iVar7 = std::__cxx11::string::compare((char *)direction);
    if (iVar7 == 0) {
      uVar9 = (uint)(0 < sign);
      uVar12 = auVar1._0_4_ + uVar9;
      uVar13 = uVar13 + uVar9;
      local_210.y = uVar13;
      local_210.x = uVar12;
      local_210.z = auVar1._8_4_ + uVar9;
      local_210.w = 0;
LAB_001251ca:
      auVar1._4_4_ = 0;
      auVar1._0_4_ = uVar12;
      auVar1._8_4_ = local_210.z;
    }
  }
  else {
    if (iVar8 == 0) {
      local_210.x = cVar14.x + iVar7;
      auVar1._4_4_ = 0;
      auVar1._0_4_ = local_210.x;
      uVar13 = uVar13 + iVar7;
      local_210.y = uVar13;
      local_210.z = cVar14.z - (uint)(0 < sign);
      auVar1._8_4_ = local_210.z;
      local_210.w = 1;
    }
    iVar8 = std::__cxx11::string::compare((char *)direction);
    cVar14 = local_210;
    if (iVar8 == 0) {
      uVar12 = auVar1._0_4_ + iVar7;
      auVar2._4_4_ = 0;
      auVar2._0_4_ = uVar12;
      local_210.x = uVar12;
      cVar6 = local_210;
      local_210.z = auVar1._8_4_ + iVar7;
      auVar2._8_4_ = local_210.z;
      local_210.w = cVar14.w;
      local_210._0_8_ = cVar6._0_8_;
      uVar13 = uVar13 - (0 < sign);
      local_210.y = uVar13;
      local_210.w = 1;
      auVar1 = auVar2;
    }
    iVar8 = std::__cxx11::string::compare((char *)direction);
    cVar14 = local_210;
    if (iVar8 == 0) {
      uVar13 = uVar13 + iVar7;
      auVar5._4_4_ = local_210.z;
      auVar5._8_4_ = local_210.w;
      auVar5._0_4_ = uVar13;
      local_210._0_8_ = auVar5._0_8_ << 0x20;
      local_210.z = auVar1._8_4_ + iVar7;
      local_210.w = cVar14.w;
      uVar12 = auVar1._0_4_ - (uint)(0 < sign);
      auVar1._4_4_ = 0;
      auVar1._0_4_ = uVar12;
      auVar1._8_4_ = local_210.z;
      local_210.x = uVar12;
      local_210.w = 1;
    }
    iVar8 = std::__cxx11::string::compare((char *)direction);
    if (iVar8 == 0) {
      uVar12 = auVar1._0_4_ + iVar7;
      uVar13 = uVar13 + iVar7;
      local_210.y = uVar13;
      local_210.x = uVar12;
      local_210.z = auVar1._8_4_ + iVar7;
      local_210.w = 1;
      goto LAB_001251ca;
    }
  }
  if ((((-1 < auVar1._0_4_) && (uVar12 = (this->super_Lattice).l, auVar1._0_4_ < (int)uVar12)) &&
      ((-1 < (int)uVar13 && ((uVar13 < uVar12 && (-1 < auVar1._8_4_)))))) &&
     (auVar1._8_4_ < (int)uVar12)) {
    iVar7 = Lattice::coordinateToIndex(&this->super_Lattice,&local_210);
    return iVar7;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1b8 = Lattice::indexToCoordinate(&this->super_Lattice,local_1fc);
  local_1d8 = local_1c8;
  local_1d0 = 0;
  local_1c8[0] = '\0';
  if (sign == -1) {
    std::operator+(&local_1f8,"-",direction);
  }
  else {
    if (sign != 1) goto LAB_001252cf;
    std::operator+(&local_1f8,"+",direction);
  }
  std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
LAB_001252cf:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"RhombicLattice::neighbour, ",0x1b);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_1d8,local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," neighbour of ",0xe);
  poVar10 = operator<<(poVar10,&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," is outside the lattice.",0x18);
  std::__cxx11::stringbuf::str();
  piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar11,(string *)&local_1f8);
  __cxa_throw(piVar11,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int RhombicLattice::neighbour(const int vertexIndex, const std::string &direction, const int sign)
{
    if (!(sign == 1 || sign == -1))
    {
        throw std::invalid_argument("Sign must be either 1 or -1.");
    }
    if (!(direction == "xy" || direction == "xz" || direction == "yz" ||
          direction == "xyz"))
    {
        throw std::invalid_argument("Direction must be one of 'xy', 'xz', 'yz' or 'xyz'.");
    }
    cartesian4 coordinate;
    coordinate = indexToCoordinate(vertexIndex);
    if (coordinate.w == 1)
    {
        if (direction == "xy")
        {
            coordinate.x = (coordinate.x + (sign > 0));
            coordinate.y = (coordinate.y + (sign > 0));
            coordinate.z = (coordinate.z + (sign < 0));
            coordinate.w = 0;
        }
        if (direction == "xz")
        {
            coordinate.x = (coordinate.x + (sign > 0));
            coordinate.z = (coordinate.z + (sign > 0));
            coordinate.y = (coordinate.y + (sign < 0));
            coordinate.w = 0;
        }
        if (direction == "yz")
        {
            coordinate.y = (coordinate.y + (sign > 0));
            coordinate.z = (coordinate.z + (sign > 0));
            coordinate.x = (coordinate.x + (sign < 0));
            coordinate.w = 0;
        }
        if (direction == "xyz")
        {
            coordinate.x = (coordinate.x + (sign > 0));
            coordinate.y = (coordinate.y + (sign > 0));
            coordinate.z = (coordinate.z + (sign > 0));
            coordinate.w = 0;
        }
    }
    else
    {
        if (direction == "xy")
        {
            coordinate.x = (coordinate.x - (sign < 0));
            coordinate.y = (coordinate.y - (sign < 0));
            coordinate.z = (coordinate.z - (sign > 0));
            coordinate.w = 1;
        }
        if (direction == "xz")
        {
            coordinate.x = (coordinate.x - (sign < 0));
            coordinate.z = (coordinate.z - (sign < 0));
            coordinate.y = (coordinate.y - (sign > 0));
            coordinate.w = 1;
        }
        if (direction == "yz")
        {
            coordinate.y = (coordinate.y - (sign < 0));
            coordinate.z = (coordinate.z - (sign < 0));
            coordinate.x = (coordinate.x - (sign > 0));
            coordinate.w = 1;
        }
        if (direction == "xyz")
        {
            coordinate.x = (coordinate.x - (sign < 0));
            coordinate.y = (coordinate.y - (sign < 0));
            coordinate.z = (coordinate.z - (sign < 0));
            coordinate.w = 1;
        }
    }
    if (coordinate.x < 0 || coordinate.x >= l || coordinate.y < 0 || coordinate.y >= l || coordinate.z < 0 || coordinate.z >= l)
    {
        std::ostringstream stream;
        cartesian4 errorCoord = indexToCoordinate(vertexIndex);
        std::string errorDir;
        if (sign == 1)
        {
            errorDir = "+" + direction;
        }
        else if (sign == -1)
        {
            errorDir = "-" + direction;
        }
        stream << "RhombicLattice::neighbour, " << errorDir << " neighbour of " << errorCoord << " is outside the lattice.";
        std::string errorMessage = stream.str();
        throw std::invalid_argument(errorMessage);
    }
    else
    {
        return coordinateToIndex(coordinate);
    }
}